

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Bias_x86_avx512::forward_inplace(Bias_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint *puVar2;
  float fVar3;
  int iVar4;
  void *pvVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  long lVar23;
  undefined1 (*pauVar24) [32];
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ushort uVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  
  iVar4 = bottom_top_blob->c;
  if (0 < (long)iVar4) {
    uVar22 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar5 = (this->super_Bias).bias_data.data;
    lVar23 = 0;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pauVar24 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar23 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      fVar3 = *(float *)((long)pvVar5 + lVar23 * 4);
      auVar36._4_4_ = fVar3;
      auVar36._0_4_ = fVar3;
      auVar36._8_4_ = fVar3;
      auVar36._12_4_ = fVar3;
      if ((int)uVar22 < 8) {
        uVar26 = 0;
      }
      else {
        iVar25 = 7;
        do {
          auVar37._0_4_ = fVar3 + *(float *)*pauVar24;
          auVar37._4_4_ = fVar3 + *(float *)((long)*pauVar24 + 4);
          auVar37._8_4_ = fVar3 + *(float *)((long)*pauVar24 + 8);
          auVar37._12_4_ = fVar3 + *(float *)((long)*pauVar24 + 0xc);
          auVar37._16_4_ = fVar3 + *(float *)((long)*pauVar24 + 0x10);
          auVar37._20_4_ = fVar3 + *(float *)((long)*pauVar24 + 0x14);
          auVar37._24_4_ = fVar3 + *(float *)((long)*pauVar24 + 0x18);
          auVar37._28_4_ = fVar3 + *(float *)((long)*pauVar24 + 0x1c);
          *pauVar24 = auVar37;
          pauVar24 = pauVar24 + 1;
          iVar25 = iVar25 + 8;
          uVar26 = uVar22 & 0xfffffff8;
        } while (iVar25 < (int)uVar22);
      }
      uVar27 = uVar26 | 3;
      while ((int)uVar27 < (int)uVar22) {
        auVar38._0_4_ = fVar3 + *(float *)*pauVar24;
        auVar38._4_4_ = fVar3 + *(float *)((long)*pauVar24 + 4);
        auVar38._8_4_ = fVar3 + *(float *)((long)*pauVar24 + 8);
        auVar38._12_4_ = fVar3 + *(float *)((long)*pauVar24 + 0xc);
        *(undefined1 (*) [16])*pauVar24 = auVar38;
        pauVar24 = (undefined1 (*) [32])((long)*pauVar24 + 0x10);
        uVar27 = uVar26 + 7;
        uVar26 = uVar26 + 4;
      }
      if ((int)uVar26 < (int)uVar22) {
        auVar32 = vpbroadcastq_avx512f();
        auVar33 = vbroadcastss_avx512f(auVar36);
        uVar28 = 0;
        do {
          auVar34 = vpbroadcastq_avx512f();
          auVar35 = vporq_avx512f(auVar34,auVar30);
          auVar34 = vporq_avx512f(auVar34,auVar31);
          uVar19 = vpcmpuq_avx512f(auVar34,auVar32,2);
          bVar20 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar35,auVar32,2);
          bVar21 = (byte)uVar19;
          uVar29 = CONCAT11(bVar21,bVar20);
          piVar1 = (int *)((long)*pauVar24 + uVar28 * 4);
          auVar34._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * piVar1[1];
          auVar34._0_4_ = (uint)(bVar20 & 1) * *piVar1;
          auVar34._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * piVar1[2];
          auVar34._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * piVar1[3];
          auVar34._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * piVar1[4];
          auVar34._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * piVar1[5];
          auVar34._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * piVar1[6];
          auVar34._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * piVar1[7];
          auVar34._32_4_ = (uint)(bVar21 & 1) * piVar1[8];
          auVar34._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar1[9];
          auVar34._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar1[10];
          auVar34._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar1[0xb];
          auVar34._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar1[0xc];
          auVar34._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar1[0xd];
          auVar34._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar1[0xe];
          auVar34._60_4_ = (uint)(bVar21 >> 7) * piVar1[0xf];
          auVar34 = vaddps_avx512f(auVar34,auVar33);
          puVar2 = (uint *)((long)*pauVar24 + uVar28 * 4);
          bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar29 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar29 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar29 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar29 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar29 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar29 >> 7) & 1);
          bVar13 = (bool)(bVar21 >> 1 & 1);
          bVar14 = (bool)(bVar21 >> 2 & 1);
          bVar15 = (bool)(bVar21 >> 3 & 1);
          bVar16 = (bool)(bVar21 >> 4 & 1);
          bVar17 = (bool)(bVar21 >> 5 & 1);
          bVar18 = (bool)(bVar21 >> 6 & 1);
          *puVar2 = (uint)(bVar20 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar20 & 1) * *puVar2;
          puVar2[1] = (uint)bVar6 * auVar34._4_4_ | (uint)!bVar6 * puVar2[1];
          puVar2[2] = (uint)bVar7 * auVar34._8_4_ | (uint)!bVar7 * puVar2[2];
          puVar2[3] = (uint)bVar8 * auVar34._12_4_ | (uint)!bVar8 * puVar2[3];
          puVar2[4] = (uint)bVar9 * auVar34._16_4_ | (uint)!bVar9 * puVar2[4];
          puVar2[5] = (uint)bVar10 * auVar34._20_4_ | (uint)!bVar10 * puVar2[5];
          puVar2[6] = (uint)bVar11 * auVar34._24_4_ | (uint)!bVar11 * puVar2[6];
          puVar2[7] = (uint)bVar12 * auVar34._28_4_ | (uint)!bVar12 * puVar2[7];
          puVar2[8] = (uint)(bVar21 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar21 & 1) * puVar2[8];
          puVar2[9] = (uint)bVar13 * auVar34._36_4_ | (uint)!bVar13 * puVar2[9];
          puVar2[10] = (uint)bVar14 * auVar34._40_4_ | (uint)!bVar14 * puVar2[10];
          puVar2[0xb] = (uint)bVar15 * auVar34._44_4_ | (uint)!bVar15 * puVar2[0xb];
          puVar2[0xc] = (uint)bVar16 * auVar34._48_4_ | (uint)!bVar16 * puVar2[0xc];
          puVar2[0xd] = (uint)bVar17 * auVar34._52_4_ | (uint)!bVar17 * puVar2[0xd];
          puVar2[0xe] = (uint)bVar18 * auVar34._56_4_ | (uint)!bVar18 * puVar2[0xe];
          puVar2[0xf] = (uint)(bVar21 >> 7) * auVar34._60_4_ |
                        (uint)!(bool)(bVar21 >> 7) * puVar2[0xf];
          uVar28 = uVar28 + 0x10;
        } while (((ulong)(~uVar26 + uVar22) + 0x10 & 0xfffffffffffffff0) != uVar28);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != iVar4);
  }
  return 0;
}

Assistant:

int Bias_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}